

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
AnalyzeFunctionDefinition
          (ExpressionContext *ctx,SynFunctionDefinition *syntax,FunctionData *genericProto,
          TypeFunction *instance,TypeBase *instanceParent,IntrusiveList<MatchData> matches,
          bool createAccess,bool hideFunction,bool checkParent)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  TypeBase *pTVar4;
  undefined4 extraout_var;
  ExprError *pEVar5;
  ExprFunctionDefinition *pEVar6;
  ExprBase *pEVar7;
  ScopeData *pSVar8;
  char *pcVar9;
  ExprFunctionDefinition *definition;
  
  if (instanceParent == (TypeBase *)0x0) {
    if (syntax->parentType == (SynBase *)0x0) {
      instanceParent = (TypeBase *)0x0;
    }
    else {
      instanceParent = AnalyzeType(ctx,syntax->parentType,true,(bool *)0x0);
      if ((instanceParent != (TypeBase *)0x0) && (instanceParent->typeID == 0)) {
        instanceParent = (TypeBase *)0x0;
      }
      if (checkParent && instanceParent != (TypeBase *)0x0) {
        pSVar8 = ctx->scope;
        if (pSVar8 == (ScopeData *)0x0) {
          pTVar4 = (TypeBase *)0x0;
        }
        else {
          do {
            pTVar4 = pSVar8->ownerType;
            if (pTVar4 != (TypeBase *)0x0) goto LAB_00163ed1;
            pSVar8 = pSVar8->scope;
          } while (pSVar8 != (ScopeData *)0x0);
          pTVar4 = (TypeBase *)0x0;
        }
LAB_00163ed1:
        if (pTVar4 != (TypeBase *)0x0) {
          if (instanceParent != pTVar4) {
            pcVar9 = (instanceParent->name).begin;
            pcVar2 = (pTVar4->name).begin;
            anon_unknown.dwarf_9fd58::Stop
                      (ctx,&syntax->super_SynBase,
                       "ERROR: cannot define class \'%.*s\' function inside the scope of class \'%.*s\'"
                       ,(ulong)(uint)(*(int *)&(instanceParent->name).end - (int)pcVar9),pcVar9,
                       (ulong)(uint)(*(int *)&(pTVar4->name).end - (int)pcVar2),pcVar2);
          }
          syntax = (SynFunctionDefinition *)syntax->parentType;
          pcVar9 = "ERROR: class name repeated inside the definition of class";
          goto LAB_001640c7;
        }
      }
    }
  }
  if ((instanceParent != (TypeBase *)0x0) &&
     ((((instanceParent->typeID == 0xc || (instanceParent->typeID == 0xd)) ||
       (instanceParent->typeID == 0xe)) || (instanceParent->typeID == 1)))) {
    bVar1 = syntax->accessor;
    pTVar4 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    if (bVar1 == true) {
      pcVar9 = "ERROR: cannot add accessor to type \'%.*s\'";
    }
    else {
      pcVar9 = "ERROR: cannot add member function to type \'%.*s\'";
    }
    pEVar5 = anon_unknown.dwarf_9fd58::ReportExpected
                       (ctx,&syntax->super_SynBase,pTVar4,pcVar9,
                        (ulong)(uint)(*(int *)&(instanceParent->name).end -
                                     (int)(instanceParent->name).begin));
    return &pEVar5->super_ExprBase;
  }
  pTVar4 = AnalyzeType(ctx,syntax->returnType,true,(bool *)0x0);
  if (pTVar4->isGeneric != true) {
    if (syntax->accessor == true && instanceParent == (TypeBase *)0x0) {
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      pEVar6 = (ExprFunctionDefinition *)CONCAT44(extraout_var,iVar3);
      pTVar4 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      (pEVar6->super_ExprBase).typeID = 0;
      (pEVar6->super_ExprBase).source = &syntax->super_SynBase;
      (pEVar6->super_ExprBase).type = pTVar4;
      (pEVar6->super_ExprBase).next = (ExprBase *)0x0;
      (pEVar6->super_ExprBase).listed = false;
      (pEVar6->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprError_00229b38;
      (pEVar6->expressions).tail = (ExprBase *)0x0;
      pEVar6->function = (FunctionData *)&pEVar6->arguments;
      pEVar6->contextArgument = (ExprVariableDefinition *)0x400000000;
    }
    else {
      pEVar6 = (ExprFunctionDefinition *)
               CreateFunctionDefinition
                         (ctx,&syntax->super_SynBase,(bool)(syntax->super_SynBase).field_0x3a,
                          (bool)(syntax->super_SynBase).field_0x3b,instanceParent,syntax->accessor,
                          pTVar4,syntax->isOperator,syntax->name,syntax->aliases,syntax->arguments,
                          syntax->expressions,genericProto,instance,matches);
      if ((pEVar6 == (ExprFunctionDefinition *)0x0) ||
         (definition = pEVar6, (pEVar6->super_ExprBase).typeID != 0x24)) {
        definition = (ExprFunctionDefinition *)0x0;
      }
      if ((definition != (ExprFunctionDefinition *)0x0) &&
         (createAccess && definition->function->scope->ownerType == (TypeBase *)0x0)) {
        pEVar7 = CreateFunctionPointer(ctx,&syntax->super_SynBase,definition,hideFunction);
        return pEVar7;
      }
    }
    return &pEVar6->super_ExprBase;
  }
  pcVar9 = "ERROR: return type can\'t be generic";
LAB_001640c7:
  anon_unknown.dwarf_9fd58::Stop(ctx,&syntax->super_SynBase,pcVar9);
}

Assistant:

ExprBase* AnalyzeFunctionDefinition(ExpressionContext &ctx, SynFunctionDefinition *syntax, FunctionData *genericProto, TypeFunction *instance, TypeBase *instanceParent, IntrusiveList<MatchData> matches, bool createAccess, bool hideFunction, bool checkParent)
{
	TypeBase *parentType = NULL;

	if(instanceParent)
	{
		parentType = instanceParent;
	}
	else if(syntax->parentType)
	{
		parentType = AnalyzeType(ctx, syntax->parentType);

		if(isType<TypeError>(parentType))
			parentType = NULL;

		if(parentType && checkParent)
		{
			if(TypeBase *currentType = ctx.GetCurrentType(ctx.scope))
			{
				if(parentType == currentType)
					Stop(ctx, syntax->parentType, "ERROR: class name repeated inside the definition of class");

				Stop(ctx, syntax, "ERROR: cannot define class '%.*s' function inside the scope of class '%.*s'", FMT_ISTR(parentType->name), FMT_ISTR(currentType->name));
			}
		}
	}

	if(parentType && (isType<TypeGeneric>(parentType) || isType<TypeGenericAlias>(parentType) || isType<TypeAuto>(parentType) || isType<TypeVoid>(parentType)))
	{
		if(syntax->accessor)
			return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: cannot add accessor to type '%.*s'", FMT_ISTR(parentType->name));

		return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: cannot add member function to type '%.*s'", FMT_ISTR(parentType->name));
	}

	TypeBase *returnType = AnalyzeType(ctx, syntax->returnType);

	if(returnType->isGeneric)
		Stop(ctx, syntax, "ERROR: return type can't be generic");

	if(syntax->accessor && !parentType)
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType());

	ExprBase *value = CreateFunctionDefinition(ctx, syntax, syntax->prototype, syntax->coroutine, parentType, syntax->accessor, returnType, syntax->isOperator, syntax->name, syntax->aliases, syntax->arguments, syntax->expressions, genericProto, instance, matches);

	if(ExprFunctionDefinition *definition = getType<ExprFunctionDefinition>(value))
	{
		if(definition->function->scope->ownerType)
			return value;

		if(createAccess)
			return CreateFunctionPointer(ctx, syntax, definition, hideFunction);
	}

	return value;
}